

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

void __thiscall fasttext::Args::Args(Args *this)

{
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  std::__cxx11::string::string(in_RDI + 0x40);
  std::__cxx11::string::string(in_RDI + 0xa8);
  std::__cxx11::string::string(in_RDI + 200);
  std::__cxx11::string::string(in_RDI + 0xf0);
  *(undefined8 *)(in_RDI + 0x60) = 0x3fa999999999999a;
  *(undefined4 *)(in_RDI + 0x6c) = 100;
  *(undefined4 *)(in_RDI + 0x70) = 5;
  *(undefined4 *)(in_RDI + 0x74) = 5;
  *(undefined4 *)(in_RDI + 0x78) = 5;
  *(undefined4 *)(in_RDI + 0x7c) = 0;
  *(undefined4 *)(in_RDI + 0x80) = 5;
  *(undefined4 *)(in_RDI + 0x84) = 1;
  *(undefined4 *)(in_RDI + 0x88) = 2;
  *(undefined4 *)(in_RDI + 0x8c) = 2;
  *(undefined4 *)(in_RDI + 0x90) = 2000000;
  *(undefined4 *)(in_RDI + 0x94) = 3;
  *(undefined4 *)(in_RDI + 0x98) = 6;
  *(undefined4 *)(in_RDI + 0x9c) = 0xc;
  *(undefined4 *)(in_RDI + 0x68) = 100;
  *(undefined8 *)(in_RDI + 0xa0) = 0x3f1a36e2eb1c432d;
  std::__cxx11::string::operator=(in_RDI + 0xa8,"__label__");
  std::__cxx11::string::operator=(in_RDI + 200,"__id__");
  *(undefined4 *)(in_RDI + 0xe8) = 2;
  std::__cxx11::string::operator=(in_RDI + 0xf0,"");
  in_RDI[0x110] = (string)0x0;
  in_RDI[0x111] = (string)0x0;
  in_RDI[0x112] = (string)0x0;
  in_RDI[0x113] = (string)0x0;
  *(undefined8 *)(in_RDI + 0x118) = 0;
  *(undefined8 *)(in_RDI + 0x120) = 2;
  return;
}

Assistant:

Args::Args() {
  lr = 0.05;
  dim = 100;
  ws = 5;
  epoch = 5;
  minCount = 5;
  minCountLabel = 0;
  neg = 5;
  wordNgrams = 1;
  loss = loss_name::ns;
  model = model_name::sg;
  bucket = 2000000;
  minn = 3;
  maxn = 6;
  thread = 12;
  lrUpdateRate = 100;
  t = 1e-4;
  label = "__label__";
  id = "__id__";
  verbose = 2;
  pretrainedVectors = "";
  saveOutput = false;

  qout = false;
  retrain = false;
  qnorm = false;
  cutoff = 0;
  dsub = 2;
}